

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void qcc_stream_end(qcc_stream *self)

{
  qcc_stream_interval *node;
  qcc_stream_interval *interval;
  qcc_stream *self_local;
  
  node = (self->interval_stack).first;
  qcc_interval_data_pop_front(&self->interval_stack);
  node->end = self->node;
  if (node->begin != node->end) {
    qcc_interval_data_push_back(&self->interval_data,node);
  }
  return;
}

Assistant:

void qcc_stream_end(struct qcc_stream *self)
{
    struct qcc_stream_interval *interval = self->interval_stack.first;
    qcc_interval_data_pop_front(&self->interval_stack);
    interval->end = self->node;
    if (interval->begin != interval->end)
        qcc_interval_data_push_back(&self->interval_data, interval);
}